

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

btScalar __thiscall btSoftBody::getVolume(btSoftBody *this)

{
  uint uVar1;
  Node *pNVar2;
  Face *pFVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  btVector3 bVar7;
  btVector3 bVar8;
  btVector3 org;
  float local_88;
  float fStack_84;
  float local_78;
  btVector3 local_68;
  btVector3 local_58;
  btVector3 local_48;
  
  if (0 < (this->m_nodes).m_size) {
    pNVar2 = (this->m_nodes).m_data;
    local_48.m_floats._0_8_ = *(undefined8 *)(pNVar2->m_x).m_floats;
    local_48.m_floats._8_8_ = *(undefined8 *)((pNVar2->m_x).m_floats + 2);
    uVar1 = (this->m_faces).m_size;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    fVar6 = 0.0;
    for (; uVar4 * 0x48 - uVar5 != 0; uVar5 = uVar5 + 0x48) {
      pFVar3 = (this->m_faces).m_data;
      bVar7 = operator-((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar5) + 0x10),&local_48);
      local_58 = operator-((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar5 + 8) + 0x10),&local_48)
      ;
      local_68 = operator-((btVector3 *)(*(long *)((long)pFVar3->m_n + uVar5 + 0x10) + 0x10),
                           &local_48);
      bVar8 = btVector3::cross(&local_58,&local_68);
      local_88 = bVar7.m_floats[0];
      fStack_84 = bVar7.m_floats[1];
      local_78 = bVar7.m_floats[2];
      fVar6 = fVar6 + bVar8.m_floats[2] * local_78 +
                      local_88 * bVar8.m_floats[0] + fStack_84 * bVar8.m_floats[1];
    }
    return fVar6 / 6.0;
  }
  return 0.0;
}

Assistant:

btScalar		btSoftBody::getVolume() const
{
	btScalar	vol=0;
	if(m_nodes.size()>0)
	{
		int i,ni;

		const btVector3	org=m_nodes[0].m_x;
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			const Face&	f=m_faces[i];
			vol+=btDot(f.m_n[0]->m_x-org,btCross(f.m_n[1]->m_x-org,f.m_n[2]->m_x-org));
		}
		vol/=(btScalar)6;
	}
	return(vol);
}